

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::cleanup::ChunkList::AddFallback
          (ChunkList *this,void *elem,_func_void_void_ptr *destructor,SerialArena *arena)

{
  ulong uVar1;
  ulong uVar2;
  Chunk *pCVar3;
  void *pvVar4;
  ulong size;
  size_t sVar5;
  long in_FS_OFFSET;
  SizedPtr SVar6;
  
  if (this->next_ != this->limit_) {
    AddFallback();
  }
  uVar2 = (arena->parent_->alloc_policy_).policy_ & 0xfffffffffffffff8;
  if (this->head_ != (Chunk *)0x0) {
    sVar5 = this->head_->size;
    uVar1 = sVar5 * 2;
    size = 0x1000;
    if (uVar1 < 0x1000) {
      size = uVar1;
    }
    if (sVar5 != 0) goto LAB_001ea108;
  }
  size = 0x40;
LAB_001ea108:
  if (uVar2 == 0) {
    if (*(code **)(in_FS_OFFSET + -0x50) == (code *)0x0) {
      pvVar4 = operator_new(size);
      SVar6.n = size;
      SVar6.p = pvVar4;
    }
    else {
      SVar6 = (SizedPtr)
              (**(code **)(in_FS_OFFSET + -0x50))(size,*(undefined8 *)(in_FS_OFFSET + -0x48));
    }
  }
  else {
    SVar6 = anon_unknown_12::AllocateMemory(*(AllocationPolicy **)(uVar2 + 0x10),size);
  }
  sVar5 = SVar6.n;
  pCVar3 = (Chunk *)SVar6.p;
  (arena->space_allocated_).super___atomic_base<unsigned_long>._M_i =
       (arena->space_allocated_).super___atomic_base<unsigned_long>._M_i + sVar5;
  pCVar3->next = this->head_;
  pCVar3->size = sVar5;
  this->head_ = pCVar3;
  this->prefetch_ptr_ = (char *)(pCVar3 + 1);
  this->limit_ = (CleanupNode *)((long)&pCVar3[1].next + (sVar5 - 0x10 & 0xfffffffffffffff0));
  this->next_ = (CleanupNode *)(pCVar3 + 2);
  pCVar3[1].next = (Chunk *)elem;
  pCVar3[1].size = (size_t)destructor;
  return;
}

Assistant:

void ChunkList::AddFallback(
    void* PROTOBUF_NONNULL elem,
    void (*PROTOBUF_NONNULL destructor)(void* PROTOBUF_NONNULL),
    SerialArena& arena) {
  ABSL_DCHECK_EQ(next_, limit_);
  SizedPtr mem = AllocateCleanupChunk(arena.parent_.AllocPolicy(),
                                      head_ == nullptr ? 0 : head_->size);
  arena.AddSpaceAllocated(mem.n);
  head_ = new (mem.p) Chunk{head_, mem.n};
  next_ = head_->First();
  prefetch_ptr_ = reinterpret_cast<char*>(next_);
  limit_ = next_ + Chunk::Capacity(mem.n);
  AddFromExisting(elem, destructor);
}